

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 703_kthLargestElement.cpp
# Opt level: O0

void __thiscall
KthLargest::KthLargest(KthLargest *this,int k,vector<int,_std::allocator<int>_> *nums)

{
  bool bVar1;
  reference piVar2;
  iterator iStack_38;
  int n;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *nums_local;
  int k_local;
  KthLargest *this_local;
  
  this->k = k;
  std::priority_queue<int,std::vector<int,std::allocator<int>>,std::greater<int>>::
  priority_queue<std::vector<int,std::allocator<int>>,void>
            ((priority_queue<int,std::vector<int,std::allocator<int>>,std::greater<int>> *)&this->pq
            );
  __end1 = std::vector<int,_std::allocator<int>_>::begin(nums);
  iStack_38 = std::vector<int,_std::allocator<int>_>::end(nums);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    add(this,*piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

KthLargest(int k, vector<int>& nums) : k(k) {
        for (int n : nums)
            add(n);
    }